

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void setnodevector(lua_State *L,Table *t,uint size)

{
  int iVar1;
  uint uVar2;
  Node *pNVar3;
  Node *n;
  int local_20;
  int lsize;
  int i;
  uint size_local;
  Table *t_local;
  lua_State *L_local;
  
  if (size == 0) {
    t->node = &dummynode_;
    t->lsizenode = '\0';
    t->lastfree = (Node *)0x0;
  }
  else {
    iVar1 = luaO_ceillog2(size);
    if (0x1e < iVar1) {
      luaG_runerror(L,"table overflow");
    }
    uVar2 = 1 << ((byte)iVar1 & 0x1f);
    pNVar3 = (Node *)luaM_realloc_(L,(void *)0x0,0,(ulong)uVar2 << 5);
    t->node = pNVar3;
    for (local_20 = 0; local_20 < (int)uVar2; local_20 = local_20 + 1) {
      pNVar3 = t->node;
      pNVar3[local_20].i_key.nk.next = 0;
      pNVar3[local_20].i_key.nk.tt_ = 0;
      pNVar3[local_20].i_val.tt_ = 0;
    }
    t->lsizenode = (byte)iVar1;
    t->lastfree = t->node + uVar2;
  }
  return;
}

Assistant:

static void setnodevector (lua_State *L, Table *t, unsigned int size) {
  if (size == 0) {  /* no elements to hash part? */
    t->node = cast(Node *, dummynode);  /* use common 'dummynode' */
    t->lsizenode = 0;
    t->lastfree = NULL;  /* signal that it is using dummy node */
  }
  else {
    int i;
    int lsize = luaO_ceillog2(size);
    if (lsize > MAXHBITS)
      luaG_runerror(L, "table overflow");
    size = twoto(lsize);
    t->node = luaM_newvector(L, size, Node);
    for (i = 0; i < (int)size; i++) {
      Node *n = gnode(t, i);
      gnext(n) = 0;
      setnilvalue(wgkey(n));
      setnilvalue(gval(n));
    }
    t->lsizenode = cast_byte(lsize);
    t->lastfree = gnode(t, size);  /* all positions are free */
  }
}